

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::io::CopyingOutputStreamAdaptor::WriteBuffer(CopyingOutputStreamAdaptor *this)

{
  int iVar1;
  
  if (this->failed_ == false) {
    if (this->buffer_used_ == 0) {
      return true;
    }
    iVar1 = (*this->copying_stream_->_vptr_CopyingOutputStream[2])
                      (this->copying_stream_,
                       (this->buffer_)._M_t.
                       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                       .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
    if ((char)iVar1 != '\0') {
      this->position_ = this->position_ + (long)this->buffer_used_;
      this->buffer_used_ = 0;
      return true;
    }
    this->failed_ = true;
    FreeBuffer(this);
  }
  return false;
}

Assistant:

bool CopyingOutputStreamAdaptor::WriteBuffer() {
  if (failed_) {
    // Already failed on a previous write.
    return false;
  }

  if (buffer_used_ == 0) return true;

  if (copying_stream_->Write(buffer_.get(), buffer_used_)) {
    position_ += buffer_used_;
    buffer_used_ = 0;
    return true;
  } else {
    failed_ = true;
    FreeBuffer();
    return false;
  }
}